

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_encode.c
# Opt level: O0

void yajl_string_encode(yajl_print_t print,void *ctx,uchar *str,size_t len,int escape_solidus)

{
  char cVar1;
  undefined8 uVar2;
  code *pcVar3;
  size_t sVar4;
  ulong in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  code *in_RDI;
  int in_R8D;
  char *escaped;
  char hexBuf [7];
  size_t end;
  size_t beg;
  char *local_48;
  char local_3f [6];
  undefined1 local_39;
  ulong local_38;
  ulong local_30;
  int local_24;
  ulong local_20;
  long local_18;
  undefined8 local_10;
  code *local_8;
  
  local_30 = 0;
  local_38 = 0;
  builtin_strncpy(local_3f,"\\u00",4);
  local_39 = 0;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (local_38 < local_20) {
    local_48 = (char *)0x0;
    cVar1 = *(char *)(local_18 + local_38);
    if (cVar1 == '\b') {
      local_48 = "\\b";
    }
    else if (cVar1 == '\t') {
      local_48 = "\\t";
    }
    else if (cVar1 == '\n') {
      local_48 = "\\n";
    }
    else if (cVar1 == '\f') {
      local_48 = "\\f";
    }
    else if (cVar1 == '\r') {
      local_48 = "\\r";
    }
    else if (cVar1 == '\"') {
      local_48 = "\\\"";
    }
    else if (cVar1 == '/') {
      if (local_24 != 0) {
        local_48 = "\\/";
      }
    }
    else if (cVar1 == '\\') {
      local_48 = "\\\\";
    }
    else if (*(byte *)(local_18 + local_38) < 0x20) {
      CharToHex(*(uchar *)(local_18 + local_38),local_3f + 4);
      local_48 = local_3f;
    }
    if (local_48 == (char *)0x0) {
      local_38 = local_38 + 1;
    }
    else {
      (*local_8)(local_10,local_18 + local_30,local_38 - local_30);
      pcVar3 = local_8;
      uVar2 = local_10;
      sVar4 = strlen(local_48);
      (*pcVar3)(uVar2,local_48,sVar4 & 0xffffffff);
      local_38 = local_38 + 1;
      local_30 = local_38;
    }
  }
  (*local_8)(local_10,local_18 + local_30,local_38 - local_30);
  return;
}

Assistant:

void
yajl_string_encode(const yajl_print_t print,
                   void * ctx,
                   const unsigned char * str,
                   size_t len,
                   int escape_solidus)
{
    size_t beg = 0;
    size_t end = 0;
    char hexBuf[7];
    hexBuf[0] = '\\'; hexBuf[1] = 'u'; hexBuf[2] = '0'; hexBuf[3] = '0';
    hexBuf[6] = 0;

    while (end < len) {
        const char * escaped = NULL;
        switch (str[end]) {
            case '\r': escaped = "\\r"; break;
            case '\n': escaped = "\\n"; break;
            case '\\': escaped = "\\\\"; break;
            /* it is not required to escape a solidus in JSON:
             * read sec. 2.5: http://www.ietf.org/rfc/rfc4627.txt
             * specifically, this production from the grammar:
             *   unescaped = %x20-21 / %x23-5B / %x5D-10FFFF
             */
            case '/': if (escape_solidus) escaped = "\\/"; break;
            case '"': escaped = "\\\""; break;
            case '\f': escaped = "\\f"; break;
            case '\b': escaped = "\\b"; break;
            case '\t': escaped = "\\t"; break;
            default:
                if ((unsigned char) str[end] < 32) {
                    CharToHex(str[end], hexBuf + 4);
                    escaped = hexBuf;
                }
                break;
        }
        if (escaped != NULL) {
            print(ctx, (const char *) (str + beg), end - beg);
            print(ctx, escaped, (unsigned int)strlen(escaped));
            beg = ++end;
        } else {
            ++end;
        }
    }
    print(ctx, (const char *) (str + beg), end - beg);
}